

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O0

bool duckdb::ColumnCountResult::UnsetComment(ColumnCountResult *result,idx_t buffer_pos)

{
  byte bVar1;
  reference pvVar2;
  vector<duckdb::ColumnCount,_true> *in_RSI;
  long in_RDI;
  bool done;
  idx_t in_stack_00000170;
  ColumnCountResult *in_stack_00000178;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = AddRow(in_stack_00000178,in_stack_00000170);
  if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
    pvVar2 = vector<duckdb::ColumnCount,_true>::operator[]
                       (in_RSI,CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    pvVar2->is_mid_comment = true;
  }
  else {
    pvVar2 = vector<duckdb::ColumnCount,_true>::operator[]
                       (in_RSI,CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    pvVar2->is_comment = true;
  }
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)(in_RDI + 0x70) = 0;
  return (bool)(bVar1 & 1);
}

Assistant:

bool ColumnCountResult::UnsetComment(ColumnCountResult &result, idx_t buffer_pos) {
	// If we are unsetting a comment, it means this row started with a comment char.
	// We add the row but tag it as a comment
	bool done = result.AddRow(result, buffer_pos);
	if (result.cur_line_starts_as_comment) {
		result.column_counts[result.result_position - 1].is_comment = true;
	} else {
		result.column_counts[result.result_position - 1].is_mid_comment = true;
	}
	result.comment = false;
	result.cur_line_starts_as_comment = false;
	return done;
}